

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

UnicodeSet * __thiscall icu_63::UnicodeSet::complementAll(UnicodeSet *this,UnicodeSet *c)

{
  UBool UVar1;
  UnicodeString *s;
  int index;
  UVector *this_00;
  
  if ((this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0) &&
     ((this->fFlags & 1) == 0)) {
    index = 0;
    exclusiveOr(this,c->list,c->len,'\0');
    this_00 = c->strings;
    if (0 < this_00->count) {
      do {
        s = (UnicodeString *)UVector::elementAt(this_00,index);
        UVar1 = UVector::removeElement(this->strings,s);
        if (UVar1 == '\0') {
          _add(this,s);
        }
        index = index + 1;
        this_00 = c->strings;
      } while (index < this_00->count);
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::complementAll(const UnicodeSet& c) {
    if (isFrozen() || isBogus()) {
        return *this;
    }
    exclusiveOr(c.list, c.len, 0);

    for (int32_t i=0; i<c.strings->size(); ++i) {
        void* e = c.strings->elementAt(i);
        if (!strings->removeElement(e)) {
            _add(*(const UnicodeString*)e);
        }
    }
    return *this;
}